

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

double r_exec::View::MorphValue(double value,double source_thr,double destination_thr)

{
  double dVar1;
  double dVar2;
  
  if ((value != 0.0) || (dVar2 = destination_thr, NAN(value))) {
    if (source_thr <= 0.0) {
      dVar2 = destination_thr + value;
    }
    else {
      dVar2 = value;
      if (0.0 < destination_thr) {
        dVar1 = (value * destination_thr) / source_thr;
        dVar2 = 1.0;
        if (dVar1 <= 1.0) {
          dVar2 = dVar1;
        }
      }
    }
  }
  return dVar2;
}

Assistant:

double View::MorphValue(double value, double source_thr, double destination_thr)
{
    if (value == 0) {
        return destination_thr;
    }

    if (source_thr > 0) {
        if (destination_thr > 0) {
            double r = value * destination_thr / source_thr;

            if (r > 1) { // handles precision errors.
                r = 1;
            }

            return r;
        } else {
            return value;
        }
    }

    return destination_thr + value;
}